

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O3

string * ApprovalTests::StringUtils::toLower(string *__return_storage_ptr__,string *inText)

{
  pointer pcVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  size_type sVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (inText->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + inText->_M_string_length);
  sVar2 = inText->_M_string_length;
  if (sVar2 != 0) {
    pcVar1 = (inText->_M_dataplus)._M_p;
    pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      iVar4 = tolower((int)pcVar1[sVar5]);
      pcVar3[sVar5] = (char)iVar4;
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

APPROVAL_TESTS_NO_DISCARD
    std::string StringUtils::toLower(std::string inText)
    {
        std::string copy(inText);
        std::transform(inText.begin(), inText.end(), copy.begin(), [](char c) {
            return static_cast<char>(tolower(c));
        });
        return copy;
    }